

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O0

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmValue cVar1;
  bool bVar2;
  CacheEntryType CVar3;
  PolicyStatus PVar4;
  size_type sVar5;
  cmMakefile *pcVar6;
  const_reference pvVar7;
  cmState *this;
  string *psVar8;
  char *__s;
  const_reference pvVar9;
  PolicyID id;
  bool local_1e9;
  string local_1e8;
  string local_1c8;
  cmStateSnapshot local_1a8;
  cmValue local_190;
  cmValue *local_188;
  cmValue *existsAfterSet;
  allocator<char> local_161;
  string local_160;
  string_view local_140;
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  string local_128 [5];
  bool init;
  string initialValue;
  string local_100;
  cmValue local_e0;
  cmValue existingValue;
  cmState *state;
  cmStateSnapshot local_c8;
  cmValue local_b0;
  cmValue *local_a8;
  cmValue *existsBeforeSet;
  byte local_95;
  PolicyStatus policyStatus;
  bool checkAndWarn;
  string_view local_88;
  string_view local_78;
  string local_68;
  undefined1 local_48 [8];
  string m;
  bool argError;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  local_1e9 = true;
  if (1 < sVar5) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    local_1e9 = 3 < sVar5;
  }
  m.field_2._M_local_buf[0xf] = local_1e9;
  if (local_1e9 == false) {
    local_95 = 0;
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    existsBeforeSet._4_4_ = cmMakefile::GetPolicyStatus(pcVar6,CMP0077,false);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    cmMakefile::GetStateSnapshot(&local_c8,pcVar6);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_b0 = cmStateSnapshot::GetDefinition(&local_c8,pvVar7);
    local_a8 = &local_b0;
    if (existsBeforeSet._4_4_ != OLD) {
      if (existsBeforeSet._4_4_ == WARN) {
        local_95 = operator!=(local_b0,(nullptr_t)0x0);
      }
      else if ((existsBeforeSet._4_4_ - NEW < 3) &&
              (bVar2 = cmValue::operator_cast_to_bool(local_a8), bVar2)) {
        return true;
      }
    }
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    this = cmMakefile::GetState(pcVar6);
    existingValue.Value = (string *)this;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_e0 = cmState::GetCacheEntryValue(this,pvVar7);
    bVar2 = cmValue::operator_cast_to_bool(&local_e0);
    cVar1 = existingValue;
    if (bVar2) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      CVar3 = cmState::GetCacheEntryType((cmState *)cVar1.Value,pvVar7);
      cVar1 = existingValue;
      if (CVar3 != UNINITIALIZED) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"HELPSTRING",
                   (allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,1);
        cmState::SetCacheEntryProperty((cmState *)cVar1.Value,pvVar7,&local_100,pvVar9);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        return true;
      }
    }
    bVar2 = cmValue::operator_cast_to_bool(&local_e0);
    local_12a = 0;
    if (bVar2) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_e0);
      std::__cxx11::string::string(local_128,(string *)psVar8);
    }
    else {
      std::allocator<char>::allocator();
      local_12a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_128,"Off",&local_129);
    }
    if ((local_12a & 1) != 0) {
      std::allocator<char>::~allocator(&local_129);
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 == 3) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      std::__cxx11::string::operator=(local_128,(string *)pvVar7);
    }
    local_140 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_128);
    local_12b = cmIsOn(local_140);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    __s = "OFF";
    if ((local_12b & 1) != 0) {
      __s = "ON";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,__s,&local_161);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,1);
    cmMakefile::AddCacheDefinition(pcVar6,pvVar7,&local_160,pvVar9,BOOL,false);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    PVar4 = cmMakefile::GetPolicyStatus(pcVar6,CMP0077,false);
    if (PVar4 != NEW) {
      pcVar6 = cmExecutionStatus::GetMakefile(status);
      PVar4 = cmMakefile::GetPolicyStatus(pcVar6,CMP0126,false);
      if (PVar4 == NEW) {
        pcVar6 = cmExecutionStatus::GetMakefile(status);
        cmMakefile::GetStateSnapshot((cmStateSnapshot *)&existsAfterSet,pcVar6);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmStateSnapshot::RemoveDefinition((cmStateSnapshot *)&existsAfterSet,pvVar7);
      }
    }
    if ((local_95 & 1) != 0) {
      pcVar6 = cmExecutionStatus::GetMakefile(status);
      cmMakefile::GetStateSnapshot(&local_1a8,pcVar6);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      local_190 = cmStateSnapshot::GetDefinition(&local_1a8,pvVar7);
      local_188 = &local_190;
      bVar2 = cmValue::operator_cast_to_bool(local_188);
      if (!bVar2) {
        pcVar6 = cmExecutionStatus::GetMakefile(status);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x4d,id);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmStrCat<std::__cxx11::string,char_const(&)[90],std::__cxx11::string_const&,char_const(&)[3]>
                  (&local_1c8,&local_1e8,
                   (char (*) [90])
                   "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
                   ,pvVar7,(char (*) [3])0x112ff16);
        cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
    args_local._7_1_ = true;
    std::__cxx11::string::~string(local_128);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78," ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88);
    cmJoin(&local_68,args,local_78,local_88);
    cmStrCat<char_const(&)[44],std::__cxx11::string>
              ((string *)local_48,(char (*) [44])"called with incorrect number of arguments: ",
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    cmExecutionStatus::SetError(status,(string *)local_48);
    args_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_48);
  }
  return args_local._7_1_;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1], cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}